

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroMessage_Test<absl::lts_20250127::Cord>
::TestBody(NoFieldPresenceMapSerializeTest_MapRoundTripNonZeroKeyNonZeroMessage_Test<absl::lts_20250127::Cord>
           *this)

{
  bool bVar1;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *this_00;
  ForeignMessage *pFVar2;
  pointer *__ptr_1;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  Cord *output;
  string_view data;
  TestAllMapTypes rt_msg;
  TestAllMapTypes msg;
  AssertHelper local_218;
  Message local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  undefined1 local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  AssertHelper local_1e0;
  key_arg<int> local_1d4;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [112];
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> local_150 [2];
  undefined1 local_f8 [128];
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> local_78 [2];
  
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
            ((TestAllMapTypes *)local_f8,(Arena *)0x0);
  this_00 = protobuf::internal::
            TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>::
            MutableMap((TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>
                        *)(local_f8 + 0x70));
  local_200._0_4_ = 0x7b;
  Map<int,proto2_nofieldpresence_unittest::ForeignMessage>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::iterator,_bool>
              *)local_1d0,this_00,(int *)local_200);
  *(undefined4 *)&((NodeBase *)(local_1d0._0_8_ + 0x28))->next = 0x2775;
  *(byte *)&((NodeBase *)(local_1d0._0_8_ + 0x20))->next =
       *(byte *)&((NodeBase *)(local_1d0._0_8_ + 0x20))->next | 1;
  output = &(this->super_NoFieldPresenceMapSerializeTest<absl::lts_20250127::Cord>).value_;
  bVar1 = MessageLite::SerializeToString((MessageLite *)local_f8,output);
  local_200[0] = (internal)bVar1;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    absl::lts_20250127::Cord::operator_cast_to_string((string *)local_1d0,output);
    local_200[0] = (internal)((UntypedMapBase *)local_1d0._8_8_ != (UntypedMapBase *)0x0);
    local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((NodeBase *)local_1d0._0_8_ == (NodeBase *)local_1c0) {
      if ((UntypedMapBase *)local_1d0._8_8_ != (UntypedMapBase *)0x0) goto LAB_0089d6b5;
    }
    else {
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
      if ((local_200._0_4_ & 1) != 0) {
LAB_0089d6b5:
        if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1f8,local_1f8);
        }
        proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes
                  ((TestAllMapTypes *)local_1d0,(Arena *)0x0);
        absl::lts_20250127::Cord::operator_cast_to_string((string *)local_200,output);
        data._M_str._4_4_ = local_200._4_4_;
        data._M_str._0_4_ = local_200._0_4_;
        data._M_len = (size_t)local_1f8;
        bVar1 = MessageLite::ParseFromString((MessageLite *)local_1d0,data);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             CONCAT31(local_210.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._1_3_,bVar1);
        local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_200._4_4_,local_200._0_4_) == &local_1f0) {
          if (!bVar1) goto LAB_0089d733;
        }
        else {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_200._4_4_,local_200._0_4_),
                          local_1f0._M_allocated_capacity + 1);
          if (((uint)local_210.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl & 1) == 0) {
LAB_0089d733:
            testing::Message::Message((Message *)&local_218);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_200,(internal *)&local_210,
                       (AssertionResult *)"rt_msg.ParseFromString(this->GetOutput())","false","true"
                       ,in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1e0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                       ,0x355,(char *)CONCAT44(local_200._4_4_,local_200._0_4_));
            testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_218);
            testing::internal::AssertHelper::~AssertHelper(&local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_200._4_4_,local_200._0_4_) != &local_1f0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_200._4_4_,local_200._0_4_),
                              local_1f0._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_218.data_._4_4_,(int32_t)local_218.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_218.data_._4_4_,(int32_t)local_218.data_) + 8))()
              ;
            }
          }
        }
        if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_208,local_208);
        }
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                  ((MapFieldBase *)(local_1c0 + 0x60));
        local_218.data_._0_4_ = 0x7b;
        pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                           (local_150,(key_arg<int> *)&local_218);
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = (pFVar2->field_0)._impl_.c_;
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                  ((MapFieldBase *)(local_f8 + 0x70));
        local_1d4 = 0x7b;
        pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                           (local_78,&local_1d4);
        local_1e0.data_._0_4_ = (pFVar2->field_0)._impl_.c_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_200,"rt_msg.map_int32_foreign_message().at(123).c()",
                   "msg.map_int32_foreign_message().at(123).c()",(int *)&local_210,(int *)&local_1e0
                  );
        if (local_200[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = (local_1f8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x358,pcVar3);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1f8,local_1f8);
        }
        local_210.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = 0x2775;
        protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
                  ((MapFieldBase *)(local_1c0 + 0x60));
        local_1e0.data_._0_4_ = 0x7b;
        pFVar2 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::at<int>
                           (local_150,(key_arg<int> *)&local_1e0);
        local_218.data_._0_4_ = (pFVar2->field_0)._impl_.c_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_200,"10101","rt_msg.map_int32_foreign_message().at(123).c()",
                   (int *)&local_210,(int *)&local_218);
        if (local_200[0] == (internal)0x0) {
          testing::Message::Message(&local_210);
          if (local_1f8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar3 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar3 = (local_1f8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
                     ,0x35c,pcVar3);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          if ((long *)CONCAT44(local_210.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._4_4_,
                               (uint)local_210.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._4_4_,
                                           (uint)local_210.ss_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl) + 8))();
          }
        }
        if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1f8,local_1f8);
        }
        proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes
                  ((TestAllMapTypes *)local_1d0);
        goto LAB_0089d98b;
      }
    }
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)local_200,
               (AssertionResult *)"this->GetOutput().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x351,(char *)local_1d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if ((NodeBase *)local_1d0._0_8_ != (NodeBase *)local_1c0) {
LAB_0089d674:
      operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
    }
  }
  else {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d0,(internal *)local_200,
               (AssertionResult *)"TestSerialize(msg, &output_sink)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x34f,(char *)local_1d0._0_8_);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    if ((NodeBase *)local_1d0._0_8_ != (NodeBase *)local_1c0) goto LAB_0089d674;
  }
  if ((long *)CONCAT44(local_210.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (uint)local_210.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_210.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (uint)local_210.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl) + 8))();
  }
  if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,local_1f8);
  }
LAB_0089d98b:
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)local_f8);
  return;
}

Assistant:

TYPED_TEST(NoFieldPresenceMapSerializeTest,
           MapRoundTripNonZeroKeyNonZeroMessage) {
  TestAllMapTypes msg;
  (*msg.mutable_map_int32_foreign_message())[123].set_c(10101);

  // Test that message can serialize.
  TypeParam& output_sink = this->GetOutputSinkRef();
  ASSERT_TRUE(TestSerialize(msg, &output_sink));
  // Maps with zero key or value fields are still serialized.
  ASSERT_FALSE(this->GetOutput().empty());

  // Test that message can roundtrip.
  TestAllMapTypes rt_msg;
  EXPECT_TRUE(rt_msg.ParseFromString(this->GetOutput()));
  // TODO: b/368089585 - write this better when we have access to EqualsProto.
  EXPECT_EQ(rt_msg.map_int32_foreign_message().at(123).c(),
            msg.map_int32_foreign_message().at(123).c());

  // The map behaviour is pretty much the same whether the key/value field is
  // zero or not.
  EXPECT_EQ(10101, rt_msg.map_int32_foreign_message().at(123).c());
}